

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx_functor::binary_op_rsub>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [32];
  float *in_RDI;
  int in_R8D;
  __m128 _outp_1;
  __m128 _b_1;
  __m256 _outp;
  __m256 _b;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_rsub op;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  int local_1dc;
  float *local_1c8;
  undefined1 (*local_1c0) [32];
  
  fVar1 = *in_RDI;
  local_1dc = 0;
  if (in_R8D == 4) {
    local_290 = *(undefined8 *)in_RDI;
    uStack_288 = *(undefined8 *)(in_RDI + 2);
  }
  else {
    local_290 = CONCAT44(fVar1,fVar1);
    uStack_288 = CONCAT44(fVar1,fVar1);
  }
  local_1c8 = in_RDX;
  local_1c0 = in_RSI;
  if (in_R8D == 8) {
    local_2c0 = *(undefined8 *)in_RDI;
    uStack_2b8 = *(undefined8 *)(in_RDI + 2);
    uStack_2b0 = *(undefined8 *)(in_RDI + 4);
    uStack_2a8 = *(undefined8 *)(in_RDI + 6);
  }
  else {
    local_2c0 = local_290;
    uStack_2b8 = uStack_288;
    uStack_2b0 = local_290;
    uStack_2a8 = uStack_288;
  }
  for (; local_1dc + 7 < in_ECX; local_1dc = local_1dc + 8) {
    auVar3._8_8_ = uStack_2b8;
    auVar3._0_8_ = local_2c0;
    auVar3._16_8_ = uStack_2b0;
    auVar3._24_8_ = uStack_2a8;
    auVar3 = vsubps_avx(*local_1c0,auVar3);
    local_260 = auVar3._0_8_;
    uStack_258 = auVar3._8_8_;
    uStack_250 = auVar3._16_8_;
    uStack_248 = auVar3._24_8_;
    *(undefined8 *)local_1c8 = local_260;
    *(undefined8 *)(local_1c8 + 2) = uStack_258;
    *(undefined8 *)(local_1c8 + 4) = uStack_250;
    *(undefined8 *)(local_1c8 + 6) = uStack_248;
    local_1c0 = local_1c0 + 1;
    local_1c8 = local_1c8 + 8;
  }
  for (; local_1dc + 3 < in_ECX; local_1dc = local_1dc + 4) {
    auVar2._8_8_ = uStack_288;
    auVar2._0_8_ = local_290;
    auVar2 = vsubps_avx(*(undefined1 (*) [16])*local_1c0,auVar2);
    local_280 = auVar2._0_8_;
    uStack_278 = auVar2._8_8_;
    *(undefined8 *)local_1c8 = local_280;
    *(undefined8 *)(local_1c8 + 2) = uStack_278;
    local_1c0 = (undefined1 (*) [32])(*local_1c0 + 0x10);
    local_1c8 = local_1c8 + 4;
  }
  for (; local_1dc < in_ECX; local_1dc = local_1dc + 1) {
    *local_1c8 = *(float *)*local_1c0 - fVar1;
    local_1c0 = (undefined1 (*) [32])(*local_1c0 + 4);
    local_1c8 = local_1c8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}